

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

void __thiscall
cinatra::coro_http_client::handle_result
          (coro_http_client *this,resp_data *data,error_code ec,bool is_keep_alive)

{
  error_category *peVar1;
  int iVar2;
  long *local_40 [2];
  long local_30 [2];
  
  peVar1 = ec._M_cat;
  iVar2 = ec._M_value;
  if (iVar2 == 0) {
    if (!is_keep_alive) {
      close_socket((this->socket_).
                   super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      return;
    }
  }
  else {
    close_socket((this->socket_).
                 super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    (data->net_err)._M_value = iVar2;
    (data->net_err)._M_cat = peVar1;
    data->status = 0x194;
    if (this->stop_bench_ == false) {
      (**(code **)(*(long *)peVar1 + 0x20))(local_40,peVar1,iVar2);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void handle_result(resp_data &data, std::error_code ec, bool is_keep_alive) {
    if (ec) {
      close_socket(*socket_);
      data.net_err = ec;
      data.status = 404;
#ifdef BENCHMARK_TEST
      if (!stop_bench_) {
        CINATRA_LOG_DEBUG << ec.message();
      }
#endif
    }
    else {
      if (!is_keep_alive) {
        close_socket(*socket_);
      }
    }
  }